

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O0

bool __thiscall
cmExportFileGenerator::PopulateInterfaceLinkLibrariesProperty
          (cmExportFileGenerator *this,cmGeneratorTarget *target,PreprocessContext preprocessRule,
          ImportPropertyMap *properties)

{
  bool bVar1;
  int iVar2;
  const_iterator pvVar3;
  string *input_00;
  ulong uVar4;
  mapped_type *this_00;
  undefined1 local_98 [8];
  string prepro;
  cmValue input;
  string *linkIfaceProp;
  const_iterator __end1;
  const_iterator __begin1;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
  *__range1;
  bool hadINTERFACE_LINK_LIBRARIES;
  allocator<char> local_39;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
  *local_38;
  ImportPropertyMap *local_30;
  ImportPropertyMap *properties_local;
  cmGeneratorTarget *pcStack_20;
  PreprocessContext preprocessRule_local;
  cmGeneratorTarget *target_local;
  cmExportFileGenerator *this_local;
  
  local_30 = properties;
  properties_local._4_4_ = preprocessRule;
  pcStack_20 = target;
  target_local = (cmGeneratorTarget *)this;
  bVar1 = cmGeneratorTarget::IsLinkable(target);
  if (bVar1) {
    if ((PopulateInterfaceLinkLibrariesProperty(cmGeneratorTarget_const*,cmGeneratorExpression::PreprocessContext,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>&)
         ::linkIfaceProps_abi_cxx11_ == '\0') &&
       (iVar2 = __cxa_guard_acquire(&PopulateInterfaceLinkLibrariesProperty(cmGeneratorTarget_const*,cmGeneratorExpression::PreprocessContext,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>&)
                                     ::linkIfaceProps_abi_cxx11_), iVar2 != 0)) {
      __range1._1_1_ = 1;
      local_38 = &PopulateInterfaceLinkLibrariesProperty(cmGeneratorTarget_const*,cmGeneratorExpression::PreprocessContext,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>&)
                  ::linkIfaceProps_abi_cxx11_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 &PopulateInterfaceLinkLibrariesProperty(cmGeneratorTarget_const*,cmGeneratorExpression::PreprocessContext,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>&)
                  ::linkIfaceProps_abi_cxx11_,"INTERFACE_LINK_LIBRARIES",&local_39);
      local_38 = (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
                  *)0x111cad0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 (PopulateInterfaceLinkLibrariesProperty(cmGeneratorTarget_const*,cmGeneratorExpression::PreprocessContext,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>&)
                  ::linkIfaceProps_abi_cxx11_._M_elems + 1),"INTERFACE_LINK_LIBRARIES_DIRECT",
                 (allocator<char> *)((long)&__range1 + 3));
      local_38 = (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
                  *)0x111caf0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 (PopulateInterfaceLinkLibrariesProperty(cmGeneratorTarget_const*,cmGeneratorExpression::PreprocessContext,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>&)
                  ::linkIfaceProps_abi_cxx11_._M_elems + 2),
                 "INTERFACE_LINK_LIBRARIES_DIRECT_EXCLUDE",(allocator<char> *)((long)&__range1 + 2))
      ;
      __range1._1_1_ = 0;
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 2));
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 3));
      std::allocator<char>::~allocator(&local_39);
      __cxa_atexit(std::
                   array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
                   ::~array,&PopulateInterfaceLinkLibrariesProperty(cmGeneratorTarget_const*,cmGeneratorExpression::PreprocessContext,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>&)
                             ::linkIfaceProps_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&PopulateInterfaceLinkLibrariesProperty(cmGeneratorTarget_const*,cmGeneratorExpression::PreprocessContext,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>&)
                           ::linkIfaceProps_abi_cxx11_);
    }
    __range1._0_1_ = 0;
    __end1 = std::
             array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
             ::begin(&PopulateInterfaceLinkLibrariesProperty(cmGeneratorTarget_const*,cmGeneratorExpression::PreprocessContext,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>&)
                      ::linkIfaceProps_abi_cxx11_);
    pvVar3 = std::
             array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
             ::end(&PopulateInterfaceLinkLibrariesProperty(cmGeneratorTarget_const*,cmGeneratorExpression::PreprocessContext,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>&)
                    ::linkIfaceProps_abi_cxx11_);
    for (; __end1 != pvVar3; __end1 = __end1 + 1) {
      prepro.field_2._8_8_ = cmGeneratorTarget::GetProperty(pcStack_20,__end1);
      bVar1 = cmValue::operator_cast_to_bool((cmValue *)((long)&prepro.field_2 + 8));
      if (bVar1) {
        input_00 = cmValue::operator*[abi_cxx11_((cmValue *)((long)&prepro.field_2 + 8));
        cmGeneratorExpression::Preprocess((string *)local_98,input_00,properties_local._4_4_,false);
        uVar4 = std::__cxx11::string::empty();
        if ((uVar4 & 1) == 0) {
          ResolveTargetsInGeneratorExpressions
                    (this,(string *)local_98,pcStack_20,ReplaceFreeTargets);
          this_00 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[](local_30,__end1);
          std::__cxx11::string::operator=((string *)this_00,(string *)local_98);
          __range1._0_1_ = 1;
        }
        std::__cxx11::string::~string((string *)local_98);
      }
    }
    this_local._7_1_ = (bool)((byte)__range1 & 1);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool cmExportFileGenerator::PopulateInterfaceLinkLibrariesProperty(
  cmGeneratorTarget const* target,
  cmGeneratorExpression::PreprocessContext preprocessRule,
  ImportPropertyMap& properties)
{
  if (!target->IsLinkable()) {
    return false;
  }
  static const std::array<std::string, 3> linkIfaceProps = {
    { "INTERFACE_LINK_LIBRARIES", "INTERFACE_LINK_LIBRARIES_DIRECT",
      "INTERFACE_LINK_LIBRARIES_DIRECT_EXCLUDE" }
  };
  bool hadINTERFACE_LINK_LIBRARIES = false;
  for (std::string const& linkIfaceProp : linkIfaceProps) {
    if (cmValue input = target->GetProperty(linkIfaceProp)) {
      std::string prepro =
        cmGeneratorExpression::Preprocess(*input, preprocessRule);
      if (!prepro.empty()) {
        this->ResolveTargetsInGeneratorExpressions(prepro, target,
                                                   ReplaceFreeTargets);
        properties[linkIfaceProp] = prepro;
        hadINTERFACE_LINK_LIBRARIES = true;
      }
    }
  }
  return hadINTERFACE_LINK_LIBRARIES;
}